

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::CLUFactor<double>::vSolveRight4update3
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int rn,
          double *vec2,double eps2,double *rhs2,int *ridx2,int rn2,double *vec3,double eps3,
          double *rhs3,int *ridx3,int rn3,double *forest,int *forestNum,int *forestIdx)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  double *vec_00;
  int *ridx_00;
  double *vec_01;
  int *rperm;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  uint rn_00;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  int rn_local;
  double local_70;
  double *local_68;
  CLUFactor<double> *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  int *local_38;
  
  ridx_00 = ridx3;
  local_58._8_4_ = in_XMM1_Dc;
  local_58._0_8_ = eps2;
  local_58._12_4_ = in_XMM1_Dd;
  local_48._8_4_ = in_XMM2_Dc;
  local_48._0_8_ = eps3;
  local_48._12_4_ = in_XMM2_Dd;
  rn_local = rn;
  local_70 = eps;
  local_68 = vec;
  local_38 = idx;
  vSolveLright3(this,rhs,ridx,&rn_local,eps,rhs2,ridx2,&rn2,eps2,rhs3,ridx3,&rn3,eps3);
  vec_01 = local_68;
  piVar3 = (this->row).perm;
  if (forest == (double *)0x0) {
    if (rn_local < 1) {
      rn_00 = 0;
    }
    else {
      uVar4 = 0;
      rn_00 = 0;
      do {
        iVar7 = ridx[uVar4];
        if (ABS(rhs[iVar7]) <= local_70) {
          rhs[iVar7] = 0.0;
        }
        else {
          iVar7 = piVar3[iVar7];
          uVar10 = rn_00;
          if (0 < (int)rn_00) {
            do {
              uVar11 = uVar10 - 1;
              uVar9 = uVar11 >> 1;
              if (iVar7 <= ridx[uVar9]) break;
              ridx[uVar10] = ridx[uVar9];
              uVar10 = uVar9;
            } while (1 < uVar11);
          }
          rn_00 = rn_00 + 1;
          ridx[(int)uVar10] = iVar7;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != (uint)rn_local);
    }
  }
  else {
    if (rn_local < 1) {
      rn_00 = 0;
    }
    else {
      lVar8 = 0;
      rn_00 = 0;
      piVar5 = forestIdx;
      do {
        iVar7 = ridx[lVar8];
        dVar1 = rhs[iVar7];
        if (ABS(dVar1) <= local_70) {
          rhs[iVar7] = 0.0;
        }
        else {
          *piVar5 = iVar7;
          iVar2 = piVar3[iVar7];
          uVar10 = rn_00;
          if (0 < (int)rn_00) {
            do {
              uVar11 = uVar10 - 1;
              uVar9 = uVar11 >> 1;
              if (iVar2 <= ridx[uVar9]) break;
              ridx[uVar10] = ridx[uVar9];
              uVar10 = uVar9;
            } while (1 < uVar11);
          }
          piVar5 = piVar5 + 1;
          rn_00 = rn_00 + 1;
          ridx[(int)uVar10] = iVar2;
          forest[iVar7] = dVar1;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < rn_local);
    }
    *forestNum = rn_00;
  }
  uVar4 = (ulong)(uint)rn2;
  if ((double)rn2 <= (double)this->thedim * 0.2) {
    if (rn2 < 1) {
      rn2 = 0;
    }
    else {
      uVar6 = 0;
      rn2 = 0;
      do {
        iVar7 = ridx2[uVar6];
        uVar10 = rn2;
        if (rhs2[iVar7] < -(double)local_58._0_8_) {
          iVar7 = piVar3[iVar7];
          if (0 < rn2) {
            do {
              uVar11 = uVar10 - 1;
              uVar9 = uVar11 >> 1;
              if (iVar7 <= ridx2[uVar9]) break;
              ridx2[uVar10] = ridx2[uVar9];
              uVar10 = uVar9;
            } while (1 < uVar11);
          }
LAB_001e179b:
          rn2 = rn2 + 1;
          ridx2[(int)uVar10] = iVar7;
        }
        else {
          if ((double)local_58._0_8_ < rhs2[iVar7]) {
            iVar7 = piVar3[iVar7];
            if (0 < rn2) {
              do {
                uVar11 = uVar10 - 1;
                uVar9 = uVar11 >> 1;
                if (iVar7 <= ridx2[uVar9]) break;
                ridx2[uVar10] = ridx2[uVar9];
                uVar10 = uVar9;
              } while (1 < uVar11);
            }
            goto LAB_001e179b;
          }
          rhs2[iVar7] = 0.0;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar4);
    }
  }
  else {
    *ridx2 = this->thedim + -1;
  }
  uVar4 = (ulong)(uint)rn3;
  if ((double)rn3 <= (double)this->thedim * 0.2) {
    if (rn3 < 1) {
      rn3 = 0;
    }
    else {
      uVar6 = 0;
      rn3 = 0;
      do {
        iVar7 = ridx_00[uVar6];
        uVar10 = rn3;
        if (rhs3[iVar7] < -(double)local_48._0_8_) {
          iVar7 = piVar3[iVar7];
          if (0 < rn3) {
            do {
              uVar11 = uVar10 - 1;
              uVar9 = uVar11 >> 1;
              if (iVar7 <= ridx_00[uVar9]) break;
              ridx_00[uVar10] = ridx_00[uVar9];
              uVar10 = uVar9;
            } while (1 < uVar11);
          }
LAB_001e189c:
          rn3 = rn3 + 1;
          ridx_00[(int)uVar10] = iVar7;
        }
        else {
          if ((double)local_48._0_8_ < rhs3[iVar7]) {
            iVar7 = piVar3[iVar7];
            if (0 < rn3) {
              do {
                uVar11 = uVar10 - 1;
                uVar9 = uVar11 >> 1;
                if (iVar7 <= ridx_00[uVar9]) break;
                ridx_00[uVar10] = ridx_00[uVar9];
                uVar10 = uVar9;
              } while (1 < uVar11);
            }
            goto LAB_001e189c;
          }
          rhs3[iVar7] = 0.0;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar4);
    }
  }
  else {
    *ridx_00 = this->thedim + -1;
  }
  rn_local = rn_00;
  local_60 = this;
  rn_local = vSolveUright(this,local_68,local_38,rhs,ridx,rn_00,local_70);
  vSolveUrightNoNZ(this,vec2,rhs2,ridx2,rn2,(double)local_58._0_8_);
  vec_00 = vec3;
  vSolveUrightNoNZ(this,vec3,rhs3,ridx_00,rn3,(double)local_48._0_8_);
  if ((this->l).updateType == 0) {
    rn_local = vSolveUpdateRight(this,vec_01,local_38,rn_local,local_70);
    vSolveUpdateRightNoNZ(this,vec2,(double)local_58._0_8_);
    vSolveUpdateRightNoNZ(this,vec_00,(double)local_48._0_8_);
  }
  return rn_local;
}

Assistant:

int CLUFactor<R>::vSolveRight4update3(R eps,
                                      R* vec, int* idx,                 /* result1 */
                                      R* rhs, int* ridx, int rn,        /* rhs1    */
                                      R* vec2, R eps2,               /* result2 */
                                      R* rhs2, int* ridx2, int rn2,     /* rhs2    */
                                      R* vec3, R eps3,               /* result3 */
                                      R* rhs3, int* ridx3, int rn3,     /* rhs3    */
                                      R* forest, int* forestNum, int* forestIdx)
{

   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;
   }

   if(rn3 > thedim * verySparseFactor4right)
   {
      ridx3[0] = thedim - 1;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn3; ++i)
      {
         k = ridx3[i];
         assert(k >= 0 && k < thedim);
         x = rhs3[k];

         if(x < -eps3)
         {
            enQueueMax(ridx3, &j, rperm[k]);
         }
         else if(x > eps3)
         {
            enQueueMax(ridx3, &j, rperm[k]);
         }
         else
            rhs3[k] = 0;
      }

      rn3 = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);
   vSolveUrightNoNZ(vec3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
      vSolveUpdateRightNoNZ(vec3, eps3);
   }

   return rn;
}